

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBcollider.cpp
# Opt level: O1

eCollSuccess __thiscall
chrono::collision::CHOBBcollider::ComputeCollisions
          (CHOBBcollider *this,ChMatrix33<double> *R1,Vector *T1,ChCollisionTree *oc1,
          ChMatrix33<double> *R2,Vector *T2,ChCollisionTree *oc2,eCollMode flag)

{
  ChMatrix33<double> *alignment;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _func_int **pp_Var7;
  double dVar8;
  eCollSuccess eVar9;
  eCollSuccess eVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 in_XMM5_Qb;
  timeval thistime;
  double local_68;
  Vector local_60;
  Vector local_48;
  
  gettimeofday((timeval *)&thistime,(__timezone_ptr_t)0x0);
  auVar11._0_8_ = (double)thistime.tv_sec;
  local_48.m_data[0] = T1->m_data[0];
  local_48.m_data[1] = T1->m_data[1];
  local_48.m_data[2] = T1->m_data[2];
  local_60.m_data[0] = T2->m_data[0];
  local_60.m_data[1] = T2->m_data[1];
  local_60.m_data[2] = T2->m_data[2];
  eVar9 = ChNarrowPhaseCollider::ComputeCollisions
                    (&this->super_ChNarrowPhaseCollider,R1,&local_48,oc1,R2,&local_60,oc2,flag);
  eVar10 = ChC_RESULT_GENERICERROR;
  if (eVar9 == ChC_RESULT_OK) {
    (this->super_ChNarrowPhaseCollider).num_bv_tests = 0;
    (this->super_ChNarrowPhaseCollider).num_geo_tests = 0;
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::Rtemp == '\0') {
      ComputeCollisions();
    }
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::bR == '\0') {
      ComputeCollisions();
    }
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::bT == '\0') {
      ComputeCollisions();
    }
    auVar11._8_8_ = 0;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (double)thistime.tv_usec;
    auVar11 = vfmadd231sd_fma(auVar11,auVar15,ZEXT816(0x3eb0c6f7a0b5ed8d));
    if (ComputeCollisions(chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::ChMatrix33<double>&,chrono::ChVector<double>,chrono::collision::ChCollisionTree*,chrono::collision::ChNarrowPhaseCollider::eCollMode)
        ::Ttemp == '\0') {
      ComputeCollisions();
    }
    alignment = &(this->super_ChNarrowPhaseCollider).R;
    thistime.tv_usec = (__suseconds_t)oc2[1]._vptr_ChCollisionTree;
    thistime.tv_sec = (__time_t)alignment;
    ChMatrix33<double>::operator=
              (&ComputeCollisions::Rtemp,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&thistime);
    thistime.tv_sec = (__time_t)oc1[1]._vptr_ChCollisionTree;
    thistime.tv_usec = (__suseconds_t)&ComputeCollisions::Rtemp;
    ChMatrix33<double>::operator=
              (&ComputeCollisions::bR,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&thistime);
    ChTransform<double>::TransformLocalToParent
              ((ChVector<double> *)(oc2[1]._vptr_ChCollisionTree + 9),
               &(this->super_ChNarrowPhaseCollider).T,alignment);
    pp_Var7 = oc1[1]._vptr_ChCollisionTree;
    dVar8 = (double)thistime.tv_usec - (double)pp_Var7[10];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *pp_Var7;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (double)thistime.tv_sec - (double)pp_Var7[9];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar8 * (double)pp_Var7[3];
    auVar15 = vfmadd231sd_fma(auVar20,auVar12,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pp_Var7[6];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_68 - (double)pp_Var7[0xb];
    auVar15 = vfmadd231sd_fma(auVar15,auVar18,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pp_Var7[1];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar8 * (double)pp_Var7[4];
    auVar1 = vfmadd231sd_fma(auVar21,auVar12,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = pp_Var7[7];
    auVar1 = vfmadd231sd_fma(auVar1,auVar18,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pp_Var7[2];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (double)thistime.tv_sec - (double)pp_Var7[9];
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar8 * (double)pp_Var7[5];
    auVar2 = vfmadd231sd_fma(auVar16,auVar13,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = pp_Var7[8];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_68 - (double)pp_Var7[0xb];
    auVar2 = vfmadd231sd_fma(auVar2,auVar19,auVar6);
    ComputeCollisions::bT.m_data[0] = auVar15._0_8_;
    ComputeCollisions::bT.m_data[1] = auVar1._0_8_;
    ComputeCollisions::bT.m_data[2] = auVar2._0_8_;
    CollideRecurse(this,&ComputeCollisions::bR,&ComputeCollisions::bT,(CHOBBTree *)oc1,0,
                   (CHOBBTree *)oc2,0,flag);
    gettimeofday((timeval *)&thistime,(__timezone_ptr_t)0x0);
    auVar14._0_8_ = (double)thistime.tv_sec;
    auVar14._8_8_ = in_XMM5_Qb;
    auVar17._0_8_ = (double)thistime.tv_usec;
    auVar17._8_8_ = in_XMM5_Qb;
    auVar15 = vfmadd132sd_fma(auVar17,auVar14,ZEXT816(0x3eb0c6f7a0b5ed8d));
    (this->super_ChNarrowPhaseCollider).query_time_secs = auVar15._0_8_ - auVar11._0_8_;
    eVar10 = ChC_RESULT_OK;
  }
  return eVar10;
}

Assistant:

ChNarrowPhaseCollider::eCollSuccess CHOBBcollider::ComputeCollisions(ChMatrix33<>& R1,
                                                                     Vector T1,
                                                                     ChCollisionTree* oc1,
                                                                     ChMatrix33<>& R2,
                                                                     Vector T2,
                                                                     ChCollisionTree* oc2,
                                                                     eCollMode flag) {
    double t1 = GetTime();

    // INHERIT parent class behavior

    if (ChNarrowPhaseCollider::ComputeCollisions(R1, T1, oc1, R2, T2, oc2, flag) != ChC_RESULT_OK)
        return ChC_RESULT_GENERICERROR;

    // Downcasting
    CHOBBTree* o1 = (CHOBBTree*)oc1;
    CHOBBTree* o2 = (CHOBBTree*)oc2;

    // clear the stats

    this->num_bv_tests = 0;
    this->num_geo_tests = 0;

    // compute the transform from o1->child(0) to o2->child(0)

    static ChMatrix33<> Rtemp;
    static ChMatrix33<> bR;
    static Vector bT;
    static Vector Ttemp;

    Rtemp = this->R * o2->child(0)->Rot;  // MxM(Rtemp,this->R,o2->child(0)->R);
    bR = o1->child(0)->Rot * Rtemp;       // MTxM(R,o1->child(0)->R,Rtemp);

    Ttemp = ChTransform<>::TransformLocalToParent(o2->child(0)->To, this->T,
                                                  this->R);  // MxVpV(Ttemp,this->R,o2->child(0)->To,this->T);
    Ttemp = Vsub(Ttemp, o1->child(0)->To);                   // VmV(Ttemp,Ttemp,o1->child(0)->To);

    bT = o1->child(0)->Rot.transpose() * Ttemp;  // MTxV(T,o1->child(0)->R,Ttemp);

    // now start with both top level BVs

    CollideRecurse(bR, bT, o1, 0, o2, 0, flag);

    double t2 = GetTime();
    this->query_time_secs = t2 - t1;

    return ChC_RESULT_OK;
}